

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::PlainGatherUint2DArray::Verify(PlainGatherUint2DArray *this)

{
  bool bVar1;
  long lVar2;
  IVec4 data;
  Vector<int,_4> local_28;
  
  tcu::Vector<int,_4>::Vector(&data);
  lVar2 = 0;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,1,1,0x8d99,0x1405,&data);
  local_28.m_data[0] = 0;
  local_28.m_data[1] = 4;
  local_28.m_data[2] = 8;
  local_28.m_data[3] = 0xc;
  bVar1 = tcu::Vector<int,_4>::operator!=(&data,&local_28);
  if (bVar1) {
    anon_unknown_0::Output
              ("Expected 0, 4, 8, 12, got: %d, %d, %d, %d",(ulong)(uint)data.m_data[0],
               (ulong)(uint)data.m_data[1],(ulong)(uint)data.m_data[2],(ulong)(uint)data.m_data[3]);
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

virtual long Verify()
	{
		IVec4 data;
		glReadPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data);
		if (data != IVec4(0, 4, 8, 12))
		{
			Output("Expected 0, 4, 8, 12, got: %d, %d, %d, %d", data.x(), data.y(), data.z(), data.w());
			return ERROR;
		}
		return NO_ERROR;
	}